

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep.c
# Opt level: O0

nsync_time nsync_time_sub(nsync_time a,nsync_time b)

{
  nsync_time nVar1;
  nsync_time b_local;
  nsync_time a_local;
  
  a_local.tv_sec = a.tv_nsec;
  b_local.tv_nsec = a.tv_sec - b.tv_sec;
  if (a_local.tv_sec < b.tv_nsec) {
    a_local.tv_sec = a_local.tv_sec + 1000000000;
    b_local.tv_nsec = b_local.tv_nsec + -1;
  }
  nVar1.tv_nsec = a_local.tv_sec - b.tv_nsec;
  nVar1.tv_sec = b_local.tv_nsec;
  return nVar1;
}

Assistant:

nsync_time nsync_time_sub (nsync_time a, nsync_time b) {
	a.tv_sec -= b.tv_sec;
	if (a.tv_nsec < b.tv_nsec) {
		a.tv_nsec += NSYNC_NS_IN_S_;
		a.tv_sec--;
	}
	a.tv_nsec -= b.tv_nsec;
	return (a);
}